

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateTransformFeedbackShaderCaseBlocks
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_bool *blockContentGenerator)

{
  TestCaseGroup *pTVar1;
  Program *pPVar2;
  ShaderSet *this;
  Shader *this_00;
  long lVar3;
  SharedPtr shaderSet;
  SharedPtr program;
  
  for (lVar3 = 0x10; lVar3 != 0x70; lVar3 = lVar3 + 0x18) {
    pTVar1 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar1,context,*(char **)((long)&PTR_typeinfo_01e5c2a0 + lVar3),
               glcts::fixed_sample_locations_values + 1);
    pPVar2 = (Program *)operator_new(0x28);
    ResourceDefinition::Program::Program(pPVar2,false);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&program,(Node *)pPVar2);
    this = (ShaderSet *)operator_new(0x30);
    ResourceDefinition::ShaderSet::ShaderSet
              (this,&program,glslVersion,*(deUint32 *)(&UNK_01e5c2a8 + lVar3),
               *(deUint32 *)(&UNK_01e5c2ac + lVar3));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&shaderSet,(Node *)this);
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
    (*blockContentGenerator)
              (context,&shaderSet,(TestCaseGroup *)pTVar1,
               *(bool *)((long)&generateTransformFeedbackShaderCaseBlocks::pipelines[0].name + lVar3
                        ));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&shaderSet);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&program);
  }
  for (lVar3 = 0xc; lVar3 != 0x3c; lVar3 = lVar3 + 0x10) {
    pTVar1 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar1,context,
               *(char **)((long)&generateTransformFeedbackShaderCaseBlocks::pipelines[3].
                                 lastStageBit + lVar3),glcts::fixed_sample_locations_values + 1);
    pPVar2 = (Program *)operator_new(0x28);
    ResourceDefinition::Program::Program(pPVar2,true);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&program,(Node *)pPVar2);
    this_00 = (Shader *)operator_new(0x28);
    ResourceDefinition::Shader::Shader
              (this_00,&program,
               *(ShaderType *)
                (&generateTransformFeedbackShaderCaseBlocks::pipelines[3].field_0x14 + lVar3),
               glslVersion);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&shaderSet,(Node *)this_00);
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
    (*blockContentGenerator)
              (context,&shaderSet,(TestCaseGroup *)pTVar1,
               *(bool *)((long)&generateTransformFeedbackShaderCaseBlocks::singleStageCases[0].name
                        + lVar3));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&shaderSet);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&program);
  }
  return;
}

Assistant:

static void generateTransformFeedbackShaderCaseBlocks (Context& context, tcu::TestCaseGroup* targetGroup, glu::GLSLVersion glslVersion, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup*, bool))
{
	static const struct
	{
		const char*	name;
		deUint32	stageBits;
		deUint32	lastStageBit;
		bool		reducedSet;
	} pipelines[] =
	{
		{
			"vertex_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT),
			(1 << glu::SHADERTYPE_VERTEX),
			false
		},
		{
			"vertex_tess_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),
			(1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),
			true
		},
		{
			"vertex_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_GEOMETRY),
			(1 << glu::SHADERTYPE_GEOMETRY),
			true
		},
		{
			"vertex_tess_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION) | (1 << glu::SHADERTYPE_GEOMETRY),
			(1 << glu::SHADERTYPE_GEOMETRY),
			true
		},
	};
	static const struct
	{
		const char*		name;
		glu::ShaderType	stage;
		bool			reducedSet;
	} singleStageCases[] =
	{
		{ "separable_vertex",		glu::SHADERTYPE_VERTEX,						false	},
		{ "separable_tess_eval",	glu::SHADERTYPE_TESSELLATION_EVALUATION,	true	},
		{ "separable_geometry",		glu::SHADERTYPE_GEOMETRY,					true	},
	};

	// monolithic pipeline
	for (int pipelineNdx = 0; pipelineNdx < DE_LENGTH_OF_ARRAY(pipelines); ++pipelineNdx)
	{
		TestCaseGroup* const						blockGroup		= new TestCaseGroup(context, pipelines[pipelineNdx].name, "");
		const ResourceDefinition::Node::SharedPtr	program			(new ResourceDefinition::Program());
		const ResourceDefinition::Node::SharedPtr	shaderSet		(new ResourceDefinition::ShaderSet(program,
																									   glslVersion,
																									   pipelines[pipelineNdx].stageBits,
																									   pipelines[pipelineNdx].lastStageBit));

		targetGroup->addChild(blockGroup);
		blockContentGenerator(context, shaderSet, blockGroup, pipelines[pipelineNdx].reducedSet);
	}

	// separable pipeline
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(singleStageCases); ++ndx)
	{
		TestCaseGroup* const						blockGroup			= new TestCaseGroup(context, singleStageCases[ndx].name, "");
		const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program(true));
		const ResourceDefinition::Node::SharedPtr	shader				(new ResourceDefinition::Shader(program, singleStageCases[ndx].stage, glslVersion));

		targetGroup->addChild(blockGroup);
		blockContentGenerator(context, shader, blockGroup, singleStageCases[ndx].reducedSet);
	}
}